

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Recycler.cpp
# Opt level: O1

void __thiscall
Memory::Recycler::EnumerateObjects
          (Recycler *this,ObjectInfoBits infoBits,_func_void_void_ptr_size_t *CallBackFunction)

{
  EnsureNotCollecting(this);
  if (this->inPartialCollectMode == true) {
    FinishPartialCollect(this,(RecyclerSweepManager *)0x0);
  }
  HeapInfoManager::EnumerateObjects(&this->autoHeap,infoBits,CallBackFunction);
  return;
}

Assistant:

void Recycler::EnumerateObjects(ObjectInfoBits infoBits, void (*CallBackFunction)(void * address, size_t size))
{
    // Make sure we are not collecting
    EnsureNotCollecting();

#if ENABLE_PARTIAL_GC
    // We are updating the free bit vector, messing up the partial collection state.
    // Just get out of partial collect mode
    // GC-CONSIDER: consider adding an option in FinishConcurrent to not get into partial collect mode during sweep.
    if (inPartialCollectMode)
    {
        FinishPartialCollect();
    }
#endif

    autoHeap.EnumerateObjects(infoBits, CallBackFunction);
    // GC-TODO: Explicit heap?
}